

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

Hashtable * __thiscall icu_63::ICUService::getVisibleIDMap(ICUService *this,UErrorCode *status)

{
  Hashtable *pHVar1;
  long *plVar2;
  int index;
  Hashtable *p;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->idCache != (Hashtable *)0x0) {
      return this->idCache;
    }
    pHVar1 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)status);
    if (pHVar1 == (Hashtable *)0x0) {
      this->idCache = (Hashtable *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      p = (Hashtable *)status;
      Hashtable::Hashtable(pHVar1,status);
      this->idCache = pHVar1;
      if (this->factories == (UVector *)0x0) {
        return pHVar1;
      }
      index = this->factories->count;
      while (0 < index) {
        index = index + -1;
        plVar2 = (long *)UVector::elementAt(this->factories,index);
        p = this->idCache;
        (**(code **)(*plVar2 + 0x20))(plVar2,p,status);
      }
      pHVar1 = this->idCache;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return pHVar1;
      }
      if (pHVar1 != (Hashtable *)0x0) {
        Hashtable::~Hashtable(pHVar1);
      }
      UMemory::operator_delete((UMemory *)pHVar1,p);
      this->idCache = (Hashtable *)0x0;
    }
  }
  return (Hashtable *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}